

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O0

void __thiscall
NewEdgeCalculator::NewEdgeCalculator
          (NewEdgeCalculator *this,double Q,double edge_quasi_cutoff,double overlap,
          bool frameshift_merge,
          unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
          *simpson_map,double edge_quasi_cutoff_single,double overlap_single,
          double edge_quasi_cutoff_mixed,uint maxPosition,bool noProb0)

{
  bool bVar1;
  reference ppVar2;
  reference pvVar3;
  undefined8 in_RDX;
  byte in_SIL;
  EdgeCalculator *in_RDI;
  byte in_R8B;
  _func_int **in_XMM0_Qa;
  _func_int **in_XMM1_Qa;
  _func_int **in_XMM2_Qa;
  _func_int **in_XMM3_Qa;
  _func_int **in_XMM4_Qa;
  _func_int **in_XMM5_Qa;
  pair<const_int,_double> *k_v;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *__range1;
  unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
  *in_stack_ffffffffffffff58;
  _Node_iterator<std::pair<const_int,_double>,_false,_false> *this_00;
  EdgeCalculator *__new_size;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  _Node_iterator_base<std::pair<const_int,_double>,_false> local_78;
  _Node_iterator_base<std::pair<const_int,_double>,_false> local_70;
  undefined8 local_68;
  byte local_4d;
  _func_int **local_48;
  _func_int **local_40;
  _func_int **local_38;
  undefined8 local_30;
  byte local_21;
  _func_int **local_20;
  _func_int **local_18;
  _func_int **local_10;
  
  local_21 = in_SIL & 1;
  local_4d = in_R8B & 1;
  local_48 = in_XMM5_Qa;
  local_40 = in_XMM4_Qa;
  local_38 = in_XMM3_Qa;
  local_30 = in_RDX;
  local_20 = in_XMM2_Qa;
  local_18 = in_XMM1_Qa;
  local_10 = in_XMM0_Qa;
  EdgeCalculator::EdgeCalculator(in_RDI);
  in_RDI->_vptr_EdgeCalculator = (_func_int **)&PTR__NewEdgeCalculator_00352dc0;
  __new_size = in_RDI + 8;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x265619);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x26562c);
  in_RDI[3]._vptr_EdgeCalculator = local_10;
  in_RDI[6]._vptr_EdgeCalculator = local_18;
  in_RDI[5]._vptr_EdgeCalculator = local_38;
  in_RDI[4]._vptr_EdgeCalculator = local_48;
  in_RDI[1]._vptr_EdgeCalculator = local_20;
  in_RDI[2]._vptr_EdgeCalculator = local_40;
  *(byte *)&in_RDI[7]._vptr_EdgeCalculator = local_21 & 1;
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_ffffffffffffff80,(size_type)__new_size);
  local_68 = local_30;
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
       ::begin(in_stack_ffffffffffffff58);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>
       ::end(in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = std::__detail::operator!=(&local_70,&local_78);
    if (!bVar1) break;
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_int,_double>,_false,_false>::operator*
                       ((_Node_iterator<std::pair<const_int,_double>,_false,_false> *)0x2656e4);
    this_00 = (_Node_iterator<std::pair<const_int,_double>,_false,_false> *)ppVar2->second;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)ppVar2->first)
    ;
    *pvVar3 = (value_type)this_00;
    std::__detail::_Node_iterator<std::pair<const_int,_double>,_false,_false>::operator++(this_00);
  }
  *(byte *)((long)&in_RDI[7]._vptr_EdgeCalculator + 1) = local_4d & 1;
  return;
}

Assistant:

NewEdgeCalculator::NewEdgeCalculator(double Q, double edge_quasi_cutoff, double overlap, bool frameshift_merge, unordered_map<int, double>& simpson_map, double edge_quasi_cutoff_single, double overlap_single, double edge_quasi_cutoff_mixed, unsigned int maxPosition, bool noProb0) {
    this->Q = Q;
    this->EDGE_QUASI_CUTOFF = edge_quasi_cutoff;
    this->EDGE_QUASI_CUTOFF_SINGLE = edge_quasi_cutoff_single;
    this->EDGE_QUASI_CUTOFF_MIXED = edge_quasi_cutoff_mixed;
    this->MIN_OVERLAP_CLIQUES = overlap;
    this->MIN_OVERLAP_SINGLE = overlap_single;
    this->FRAMESHIFT_MERGE = frameshift_merge;
    this->SIMPSON_MAP.resize(maxPosition+1);
    for(auto& k_v : simpson_map){
        this->SIMPSON_MAP[k_v.first] = k_v.second;
    }
    this->NOPROB0 = noProb0;
}